

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
::_update_barcode(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
                  *this,Pos_index birth)

{
  Pos_index *pPVar1;
  value_type_conflict1 *__x;
  
  __x = (this->super_Chain_vine_swap_option).super_type.
        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
        .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start + birth;
  *(Pos_index *)
   ((long)(this->super_Chain_vine_swap_option).super_type.
          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
          .barcode_.
          super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8 + (ulong)*__x * 0xc) =
       (this->super_Chain_vine_swap_option).super_type.
       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
       .nextPosition_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&(this->super_Chain_vine_swap_option).super_type.
              super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
              .indexToBar_,__x);
  pPVar1 = &(this->super_Chain_vine_swap_option).super_type.
            super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false,_true>_>_>
            .nextPosition_;
  *pPVar1 = *pPVar1 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_barcode(Pos_index birth)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      auto& barIt = _indexToBar().at(birth);
      barIt->death = _nextPosition();
      _indexToBar().try_emplace(_nextPosition(), barIt);  // list so iterators are stable
    } else {
      _barcode()[_indexToBar()[birth]].death = _nextPosition();
      _indexToBar().push_back(_indexToBar()[birth]);
    }
    ++_nextPosition();
  }
}